

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconstruction.cpp
# Opt level: O2

void lts2::RealReconstructionWithIHT
               (Mat *X,LBDOperator *LBD,Mat *realDescriptor,int iterations,float sparsityCoeff,
               Size *patchSize,float patchMean,int norm,string *wavelet)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  _InputArray *p_Var4;
  ostream *poVar5;
  int iVar6;
  ulong uVar7;
  double dVar8;
  undefined8 uVar9;
  int wh;
  int fsize;
  int ww;
  double *Q;
  double *P;
  int local_268;
  float local_264;
  int local_260;
  float local_25c;
  double local_258;
  LBDOperator *local_250;
  Mat *local_248;
  _InputArray local_240;
  Scalar_<double> local_228 [3];
  Mat X_im;
  Size local_168;
  Size local_160;
  int local_158;
  int local_154;
  Mat Ax;
  Mat C0;
  Mat nablaJ;
  
  local_268 = norm;
  local_260 = iterations;
  local_25c = patchMean;
  local_250 = LBD;
  if ((norm == 2) || (norm == 4)) {
    if ((*(uint *)realDescriptor & 0xfff) == 5) {
      local_258 = (double)CONCAT71(local_258._1_7_,norm == 4);
      iVar6 = *(int *)(realDescriptor + 0xc);
      if (*(int *)(realDescriptor + 0xc) < *(int *)(realDescriptor + 8)) {
        iVar6 = *(int *)(realDescriptor + 8);
      }
      dVar8 = 1.0;
      if ((double)sparsityCoeff <= 1.0) {
        dVar8 = (double)sparsityCoeff;
      }
      iVar1 = patchSize->width;
      iVar2 = patchSize->height;
      local_248 = realDescriptor;
      local_264 = rintf((float)(iVar2 * iVar1) *
                        (float)(double)(~-(ulong)(dVar8 <= 0.0) & (ulong)dVar8));
      local_158 = iVar1;
      local_154 = iVar2;
      cv::Mat::create(X,&local_158,5);
      cv::Scalar_<double>::Scalar_((Scalar_<double> *)&X_im,0.0);
      _Ax = -0x3efdfffa;
      cv::noArray();
      cv::Mat::setTo((_InputArray *)X,(_InputArray *)&Ax);
      cv::Mat::Mat(&X_im);
      cv::Mat::Mat(&Ax);
      cv::Mat::Mat(&nablaJ);
      P = (double *)0x0;
      Q = (double *)0x0;
      fsize = 0;
      WaveletCoef(wavelet,&P,&Q,&fsize);
      local_160 = *patchSize;
      cv::Mat::create(&X_im,&local_160,5);
      cv::Scalar_<double>::Scalar_((Scalar_<double> *)&C0,(double)local_25c);
      local_228[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
           (double)CONCAT44(local_228[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]._4_4_,
                            0xc1020006);
      local_228[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 8.48798316435515e-314;
      local_228[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = (double)&C0;
      cv::noArray();
      cv::Mat::setTo((_InputArray *)&X_im,(_InputArray *)local_228);
      WaveletTransform2D(&X_im,X,P,Q,fsize,&ww,&wh,-1);
      local_240.flags = 0;
      local_240._4_4_ = 0;
      cv::Mat::Mat((Mat *)local_228,X,(Rect_ *)&local_240);
      cv::Mat::clone();
      uVar9 = 0x10a9b9;
      cv::Mat::~Mat((Mat *)local_228);
      InverseWaveletTransform2D(X,&X_im,P,Q,fsize,&ww,&wh);
      local_168 = *patchSize;
      cv::Mat::create(X,&local_168,5,uVar9);
      cv::Scalar_<double>::Scalar_(local_228,0.0);
      local_240.flags = -0x3efdfffa;
      local_240.sz.width = 1;
      local_240.sz.height = 4;
      local_240.obj = local_228;
      cv::noArray();
      uVar9 = 0x10aa3a;
      cv::Mat::setTo((_InputArray *)X,&local_240);
      if (local_268 == 4) {
        (*(local_250->super_LinearOperator)._vptr_LinearOperator[3])(local_250,local_248,&X_im);
        WaveletTransform2D(&X_im,X,P,Q,fsize,&ww,&wh,-1);
        local_228[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
        local_228[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
             (double)CONCAT44(local_228[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0].
                              _4_4_,0x1010000);
        local_228[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = (double)X;
        p_Var4 = (_InputArray *)cv::noArray();
        uVar9 = 0x10aab3;
        dVar8 = (double)cv::norm((_InputArray *)local_228,4,p_Var4);
        if (0.0 < (float)dVar8) {
          local_228[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = (double)(float)dVar8;
          uVar9 = 0x10aad4;
          cv::operator/=(X,(double *)local_228);
        }
      }
      local_264 = (float)(int)local_264;
      local_258 = (double)(float)(*(double *)(&DAT_00112320 + ((ulong)local_258 & 0xff) * 8) /
                                 (double)iVar6);
      iVar6 = 0;
      bVar3 = false;
      while (!bVar3) {
        InverseWaveletTransform2D(X,&X_im,P,Q,fsize,&ww,&wh);
        (*(local_250->super_LinearOperator)._vptr_LinearOperator[2])(local_250,&X_im,&Ax,uVar9);
        cv::operator-=(&Ax,local_248);
        if (local_268 == 2) {
          local_228[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
          local_228[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (double)CONCAT44(local_228[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0].
                                _4_4_,0x1010000);
          local_228[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = (double)&Ax;
          p_Var4 = (_InputArray *)cv::noArray();
          dVar8 = (double)cv::norm((_InputArray *)local_228,4,p_Var4);
          uVar7 = -(ulong)(1e-06 < (double)(float)dVar8);
          local_228[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (double)(~uVar7 & 0x3ff0000000000000 | (ulong)(double)(float)dVar8 & uVar7);
          cv::operator/=(&Ax,(double *)local_228);
        }
        (*(local_250->super_LinearOperator)._vptr_LinearOperator[3])(local_250,&Ax,&X_im);
        WaveletTransform2D(&X_im,&nablaJ,P,Q,fsize,&ww,&wh,-1);
        local_228[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = local_258;
        cv::operator*=(&nablaJ,(double *)local_228);
        cv::operator-=(X,&nablaJ);
        ProxL0(X,(int)local_264);
        InverseWaveletTransform2D(X,&X_im,P,Q,fsize,&ww,&wh);
        ProxRangeConstraint(&X_im,0.0,1.0);
        ProxMeanConstraint(&X_im,local_25c);
        uVar9 = 0xffffffffffffffff;
        WaveletTransform2D(&X_im,X,P,Q,fsize,&ww,&wh,-1);
        iVar6 = iVar6 + 1;
        bVar3 = local_260 <= iVar6;
      }
      poVar5 = std::operator<<((ostream *)&std::cout,"Stopped after ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar6);
      poVar5 = std::operator<<(poVar5," iterations ");
      poVar5 = std::operator<<(poVar5," (max allowed was ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_260);
      poVar5 = std::operator<<(poVar5,")");
      std::endl<char,std::char_traits<char>>(poVar5);
      local_228[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
      local_228[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
           (double)CONCAT44(local_228[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]._4_4_,
                            0x1010000);
      local_228[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = (double)X;
      p_Var4 = (_InputArray *)cv::noArray();
      dVar8 = (double)cv::norm((_InputArray *)local_228,4,p_Var4);
      uVar7 = -(ulong)((double)(float)dVar8 < 1e-06);
      local_228[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
           (double)(~uVar7 & (ulong)(double)(float)dVar8 | uVar7 & 0x3ff0000000000000);
      cv::operator/=(X,(double *)local_228);
      InverseWaveletTransform2D(X,&X_im,P,Q,fsize,&ww,&wh);
      local_228[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
      local_240.sz.width = 0;
      local_240.sz.height = 0;
      local_228[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
           (double)CONCAT44(local_228[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]._4_4_,
                            0x1010000);
      local_240.flags = 0x3010000;
      local_240.obj = X;
      local_228[0].super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = (double)&X_im;
      p_Var4 = (_InputArray *)cv::noArray();
      cv::normalize((_InputArray *)local_228,(_InputOutputArray *)&local_240,0.0,1.0,0x20,-1,p_Var4)
      ;
      if (P != (double *)0x0) {
        operator_delete__(P);
      }
      if (Q != (double *)0x0) {
        operator_delete__(Q);
      }
      cv::Mat::~Mat(&C0);
      cv::Mat::~Mat(&nablaJ);
      cv::Mat::~Mat(&Ax);
      cv::Mat::~Mat(&X_im);
      return;
    }
    std::__cxx11::string::string((string *)&X_im,"realDescriptor.type() == CV_32F",(allocator *)&Ax)
    ;
    cv::error(-0xd7,(string *)&X_im,"RealReconstructionWithIHT",
              "/workspace/llm4binary/github/license_c_cmakelists/sansuiso[P]LBDReconstruction/src/LBDReconstruction/reconstruction.cpp"
              ,0x313);
  }
  std::__cxx11::string::string
            ((string *)&X_im,"norm == cv::NORM_L1 || norm == cv::NORM_L2",(allocator *)&Ax);
  uVar9 = cv::error(-0xd7,(string *)&X_im,"RealReconstructionWithIHT",
                    "/workspace/llm4binary/github/license_c_cmakelists/sansuiso[P]LBDReconstruction/src/LBDReconstruction/reconstruction.cpp"
                    ,0x312);
  cv::Mat::~Mat(&C0);
  cv::Mat::~Mat(&nablaJ);
  cv::Mat::~Mat(&Ax);
  cv::Mat::~Mat(&X_im);
  _Unwind_Resume(uVar9);
}

Assistant:

void lts2::RealReconstructionWithIHT(cv::Mat &X, LBDOperator &LBD, cv::Mat const &realDescriptor,
                                     int iterations, float sparsityCoeff, cv::Size patchSize, float patchMean,
                                     int norm, std::string const &wavelet)
{
  CV_Assert(norm == cv::NORM_L1 || norm == cv::NORM_L2);
  CV_Assert(realDescriptor.type() == CV_32F);

  int const M = MAX(realDescriptor.rows, realDescriptor.cols);
  float const tau = (norm == cv::NORM_L2 ? 1.0/(float)M : 0.5/(float)M);

  sparsityCoeff = MAX(MIN(sparsityCoeff, 1.0), 0.0);
  int const K = (int)rintf( sparsityCoeff*patchSize.area() );

  X.create(patchSize, CV_32FC1);
  X.setTo(cv::Scalar(0.0));

  cv::Mat X_im;
  cv::Mat Ax;
  cv::Mat nablaJ;

  // Wavelet basis
  double *P = NULL, *Q = NULL;
  int fsize = 0, ww, wh;
  lts2::WaveletCoef(wavelet, &P, &Q, &fsize);

  X_im.create(patchSize, CV_32F);
  X_im.setTo(cv::Scalar(patchMean));
  lts2::WaveletTransform2D(X_im, X, P, Q, fsize, &ww, &wh);
  cv::Mat C0 = X(cv::Rect(0,0,ww,wh)).clone();
  lts2::InverseWaveletTransform2D(X, X_im, P, Q, fsize, &ww, &wh);

  // Special init if norm = L2
  X.create(patchSize, CV_32FC1);
  X.setTo(cv::Scalar(0.0));
  if (norm == cv::NORM_L2)
  {
    LBD.ApplyConjugate(realDescriptor, X_im);
    lts2::WaveletTransform2D(X_im, X, P, Q, fsize, &ww, &wh);
    float norm_x = cv::norm(X);
    if (norm_x > 0.0) X /= norm_x;
  }

  bool hasConverged = false;
  int iter = 0;

  while (!hasConverged)
  {
    // Back from the wavelet world
    lts2::InverseWaveletTransform2D(X, X_im, P, Q, fsize, &ww, &wh);
    LBD.Apply(X_im, Ax);
    Ax -= realDescriptor;

    // Step 1a : gradient
    if (norm == cv::NORM_L1)
    {
      float norm_error = cv::norm(Ax);
      norm_error = (norm_error > LTS2_EPSILON ? norm_error : 1.0);
      Ax /= norm_error;
    }

    LBD.ApplyConjugate(Ax, X_im);
    lts2::WaveletTransform2D(X_im, nablaJ, P, Q, fsize, &ww, &wh);
    nablaJ *= tau;

    X -= nablaJ;

    lts2::ProxL0(X, K);
    
    lts2::InverseWaveletTransform2D(X, X_im, P, Q, fsize, &ww, &wh);
    lts2::ProxRangeConstraint(X_im, 0.0, 1.0);
    lts2::ProxMeanConstraint(X_im, patchMean);
    lts2::WaveletTransform2D(X_im, X, P, Q, fsize, &ww, &wh);

    // Termination criterion
    hasConverged = (++iter >= iterations);  // Iterations count limit
    // TODO : test consistancy here (hasConverged |= ...)
  }

#ifdef DEBUG
  std::cout << "Stopped after " << iter << " iterations " << " (max allowed was " << iterations << ")" << std::endl;
#endif

  // Normalize by projecting to the sphere
  float norm_x = cv::norm(X);
  if (norm_x < LTS2_EPSILON)
    norm_x = 1.0;
  X /= norm_x;

  lts2::InverseWaveletTransform2D(X, X_im, P, Q, fsize, &ww, &wh);
  cv::normalize(X_im, X, 0.0, 1.0, cv::NORM_MINMAX);

  // Cleanup
  delete[] P;
  delete[] Q;
}